

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O2

boolean landing_spot(coord *spot,int reason,int forceit)

{
  monst *pmVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  trap *ptVar5;
  obj *poVar6;
  char cVar7;
  uint y;
  uint x;
  uint local_54;
  int local_50;
  
  if (((((reason != 6) || (u.uprops[0x1b].intrinsic != 0)) || (u.umonnum == 0x9e)) ||
      (((youmonst.data)->mlet == '\x1c' || (u.uprops[0x1c].intrinsic != 0)))) ||
     ((u.uprops[0x25].intrinsic != 0 || (local_54 = 0, u.uprops[0x25].extrinsic != 0)))) {
    local_54 = 1;
  }
  local_50 = -1;
  cVar7 = '\0';
  for (; (cVar7 == '\0' && (local_54 < 2)); local_54 = local_54 + 1) {
    uVar3 = (uint)u.ux;
    cVar7 = '\0';
    for (x = uVar3 - 1; (int)x <= (char)uVar3 + 1; x = x + 1) {
      uVar3 = (uint)u.uy;
      for (y = uVar3 - 1; (int)y <= (int)((int)(char)uVar3 + 1U); y = y + 1) {
        if (((((y < 0x15 && x - 1 < 0x4f) &&
              (((y != (int)(char)uVar3 || (x != (int)u.ux)) && ('\x16' < level->locations[x][y].typ)
               ))) && (((pmVar1 = level->monsters[x][y], pmVar1 == (monst *)0x0 ||
                        ((pmVar1->field_0x61 & 2) != 0)) &&
                       (bVar2 = closed_door(level,x,y), bVar2 == '\0')))) &&
            ((iVar4 = dist2(x,y,(int)u.ux,(int)u.uy), iVar4 < local_50 || local_50 < 0 ||
             ((iVar4 == local_50 && (uVar3 = mt_random(), (uVar3 & 1) != 0)))))) &&
           ((local_54 != 0 ||
            (((ptVar5 = t_at(level,x,y), ptVar5 == (trap *)0x0 || ((ptVar5->field_0x8 & 0x20) == 0))
             && ((poVar6 = sobj_at(0x214,level,x,y), poVar6 == (obj *)0x0 ||
                 (((youmonst.data)->mflags2 & 0x8000000) != 0)))))))) {
          spot->x = (xchar)x;
          spot->y = (xchar)y;
          cVar7 = '\x01';
          local_50 = iVar4;
        }
        uVar3 = (uint)(byte)u.uy;
      }
      uVar3 = (uint)(byte)u.ux;
    }
  }
  if ((forceit != 0) &&
     ((local_50 < 0 && (bVar2 = enexto(spot,level,u.ux,u.uy,youmonst.data), bVar2 == '\0')))) {
    cVar7 = '\0';
  }
  return cVar7;
}

Assistant:

static boolean landing_spot(coord *spot, /* landing position (we fill it in) */
			    int reason, 
			    int forceit)
{
    int i = 0, x, y, distance, min_distance = -1;
    boolean found = FALSE;
    struct trap *t;

    /* avoid known traps (i == 0) and boulders, but allow them as a backup */
    if (reason != DISMOUNT_BYCHOICE || Stunned || Confusion || Fumbling) i = 1;
    for (; !found && i < 2; ++i) {
	for (x = u.ux-1; x <= u.ux+1; x++)
	    for (y = u.uy-1; y <= u.uy+1; y++) {
		if (!isok(x, y) || (x == u.ux && y == u.uy)) continue;

		if (ACCESSIBLE(level->locations[x][y].typ) &&
			    !MON_AT(level, x,y) && !closed_door(level, x,y)) {
		    distance = distu(x,y);
		    if (min_distance < 0 || distance < min_distance ||
			    (distance == min_distance && rn2(2))) {
			if (i > 0 || (((t = t_at(level, x, y)) == 0 || !t->tseen) &&
				      (!sobj_at(BOULDER, level, x, y) ||
				       throws_rocks(youmonst.data)))) {
			    spot->x = x;
			    spot->y = y;
			    min_distance = distance;
			    found = TRUE;
			}
		    }
		}
	    }
    }

    /* If we didn't find a good spot and forceit is on, try enexto(). */
    if (forceit && min_distance < 0 &&
		!enexto(spot, level, u.ux, u.uy, youmonst.data))
	return FALSE;

    return found;
}